

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * ghc::filesystem::canonical(path *p,error_code *ec)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  file_type fVar4;
  size_type sVar5;
  error_code *in_RDX;
  error_code *in_RDI;
  error_code eVar6;
  path target;
  file_status sls;
  path pe;
  iterator __end3;
  iterator __begin3;
  path *__range3;
  size_type rootPathLen;
  bool redo;
  file_status fs;
  path result;
  path work;
  int in_stack_fffffffffffffd28;
  undefined2 in_stack_fffffffffffffd2c;
  undefined1 in_stack_fffffffffffffd2e;
  byte in_stack_fffffffffffffd2f;
  iterator *in_stack_fffffffffffffd30;
  iterator *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd44;
  byte in_stack_fffffffffffffd45;
  byte in_stack_fffffffffffffd46;
  byte in_stack_fffffffffffffd47;
  reference in_stack_fffffffffffffd48;
  undefined7 in_stack_fffffffffffffd50;
  path *lhs;
  error_code *p_00;
  file_status local_230 [5];
  file_status in_stack_fffffffffffffdf8;
  string local_1e0 [64];
  error_code *in_stack_fffffffffffffe60;
  path *in_stack_fffffffffffffe68;
  path *in_stack_fffffffffffffed0;
  path *in_stack_fffffffffffffed8;
  iterator local_f0;
  path *local_a8;
  iterator *local_a0;
  byte local_95;
  int local_88;
  undefined4 uStack_84;
  error_category *local_80;
  int local_74;
  file_status local_70 [5];
  path local_48;
  int local_28;
  undefined4 uStack_24;
  error_category *local_20;
  error_code *local_18;
  
  p_00 = in_RDI;
  local_18 = in_RDX;
  bVar1 = path::empty((path *)0x12f819);
  if (bVar1) {
    eVar6 = detail::make_error_code((portable_error)((ulong)in_stack_fffffffffffffd30 >> 0x20));
    local_20 = eVar6._M_cat;
    local_28 = eVar6._M_value;
    *(ulong *)local_18 = CONCAT44(uStack_24,local_28);
    local_18->_M_cat = local_20;
    path::path((path *)0x12f861);
  }
  else {
    bVar1 = path::is_absolute((path *)0x12f873);
    if (bVar1) {
      path::path((path *)in_stack_fffffffffffffd30,
                 (path *)CONCAT17(in_stack_fffffffffffffd2f,
                                  CONCAT16(in_stack_fffffffffffffd2e,
                                           CONCAT24(in_stack_fffffffffffffd2c,
                                                    in_stack_fffffffffffffd28))));
    }
    else {
      absolute(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    }
    path::path((path *)0x12f8ba);
    status(in_stack_fffffffffffffd48,
           (error_code *)
           CONCAT17(in_stack_fffffffffffffd47,
                    CONCAT16(in_stack_fffffffffffffd46,
                             CONCAT15(in_stack_fffffffffffffd45,
                                      CONCAT14(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40))
                            )));
    bVar1 = std::error_code::operator_cast_to_bool(local_18);
    if (bVar1) {
      path::path((path *)0x12f8f4);
      local_74 = 1;
    }
    else {
      fVar4 = file_status::type(local_70);
      if (fVar4 == not_found) {
        eVar6 = detail::make_error_code((portable_error)((ulong)in_stack_fffffffffffffd30 >> 0x20));
        local_80 = eVar6._M_cat;
        local_88 = eVar6._M_value;
        *(ulong *)local_18 = CONCAT44(uStack_84,local_88);
        local_18->_M_cat = local_80;
        path::path((path *)0x12f96c);
        local_74 = 1;
      }
      else {
        do {
          lhs = &local_48;
          sVar5 = path::root_name_length((path *)in_stack_fffffffffffffd38);
          bVar1 = path::has_root_directory
                            ((path *)CONCAT17(in_stack_fffffffffffffd47,
                                              CONCAT16(in_stack_fffffffffffffd46,
                                                       CONCAT15(in_stack_fffffffffffffd45,
                                                                CONCAT14(in_stack_fffffffffffffd44,
                                                                         in_stack_fffffffffffffd40))
                                                      )));
          local_a0 = (iterator *)(sVar5 + bVar1);
          local_95 = 0;
          path::clear((path *)0x12f9ed);
          local_a8 = &local_48;
          path::begin(in_stack_fffffffffffffd48);
          path::end(in_stack_fffffffffffffd48);
          while (uVar2 = path::iterator::operator!=
                                   (in_stack_fffffffffffffd30,
                                    (iterator *)
                                    CONCAT17(in_stack_fffffffffffffd2f,
                                             CONCAT16(in_stack_fffffffffffffd2e,
                                                      CONCAT24(in_stack_fffffffffffffd2c,
                                                               in_stack_fffffffffffffd28)))),
                (bool)uVar2) {
            in_stack_fffffffffffffd48 = path::iterator::operator*(&local_f0);
            path::path((path *)in_stack_fffffffffffffd30,
                       (path *)CONCAT17(in_stack_fffffffffffffd2f,
                                        CONCAT16(in_stack_fffffffffffffd2e,
                                                 CONCAT24(in_stack_fffffffffffffd2c,
                                                          in_stack_fffffffffffffd28))));
            bVar1 = path::empty((path *)0x12fac9);
            in_stack_fffffffffffffd47 = 1;
            bVar3 = in_stack_fffffffffffffd47;
            if (!bVar1) {
              path::path<char[2],ghc::filesystem::path>
                        ((path *)CONCAT17(uVar2,in_stack_fffffffffffffd50),
                         (char (*) [2])in_stack_fffffffffffffd48,
                         CONCAT13(1,CONCAT12(in_stack_fffffffffffffd46,
                                             CONCAT11(in_stack_fffffffffffffd45,
                                                      in_stack_fffffffffffffd44))));
              bVar3 = operator==((path *)in_stack_fffffffffffffd30,
                                 (path *)CONCAT17(in_stack_fffffffffffffd2f,
                                                  CONCAT16(in_stack_fffffffffffffd2e,
                                                           CONCAT24(in_stack_fffffffffffffd2c,
                                                                    in_stack_fffffffffffffd28))));
              in_stack_fffffffffffffd47 = bVar3;
              path::~path((path *)0x12fb3b);
            }
            in_stack_fffffffffffffd46 = bVar3;
            if ((in_stack_fffffffffffffd46 & 1) == 0) {
              path::path<char[3],ghc::filesystem::path>
                        ((path *)CONCAT17(uVar2,in_stack_fffffffffffffd50),
                         (char (*) [3])in_stack_fffffffffffffd48,
                         CONCAT13(in_stack_fffffffffffffd47,
                                  CONCAT12(in_stack_fffffffffffffd46,
                                           CONCAT11(in_stack_fffffffffffffd45,
                                                    in_stack_fffffffffffffd44))));
              in_stack_fffffffffffffd45 =
                   operator==((path *)in_stack_fffffffffffffd30,
                              (path *)CONCAT17(in_stack_fffffffffffffd2f,
                                               CONCAT16(in_stack_fffffffffffffd2e,
                                                        CONCAT24(in_stack_fffffffffffffd2c,
                                                                 in_stack_fffffffffffffd28))));
              path::~path((path *)0x12fbaf);
              if ((in_stack_fffffffffffffd45 & 1) == 0) {
                operator/(lhs,(path *)CONCAT17(uVar2,in_stack_fffffffffffffd50));
                path::string_abi_cxx11_((path *)in_stack_fffffffffffffd38);
                in_stack_fffffffffffffd38 = (iterator *)std::__cxx11::string::length();
                in_stack_fffffffffffffd30 = local_a0;
                std::__cxx11::string::~string(local_1e0);
                path::~path((path *)0x12fc71);
                if (in_stack_fffffffffffffd30 < in_stack_fffffffffffffd38) {
                  operator/(lhs,(path *)CONCAT17(uVar2,in_stack_fffffffffffffd50));
                  symlink_status((path *)in_stack_fffffffffffffd38,
                                 (error_code *)in_stack_fffffffffffffd30);
                  path::~path((path *)0x12fd1a);
                  bVar1 = std::error_code::operator_cast_to_bool(local_18);
                  if (bVar1) {
                    path::path((path *)0x12fd37);
                    local_74 = 1;
                  }
                  else {
                    file_status::file_status(local_230,(file_status *)&stack0xfffffffffffffdf8);
                    in_stack_fffffffffffffd2f = is_symlink((file_status *)0x12fd69);
                    file_status::~file_status(local_230);
                    if ((in_stack_fffffffffffffd2f & 1) == 0) {
                      path::operator/=(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
                      local_74 = 0;
                    }
                    else {
                      local_95 = 1;
                      operator/(lhs,(path *)CONCAT17(uVar2,in_stack_fffffffffffffd50));
                      read_symlink((path *)p_00,in_RDI);
                      path::~path((path *)0x12fdd1);
                      bVar1 = std::error_code::operator_cast_to_bool(local_18);
                      if (bVar1) {
                        path::path((path *)0x12fdee);
                        local_74 = 1;
                      }
                      else {
                        in_stack_fffffffffffffd2e = path::is_absolute((path *)0x12fe47);
                        if ((bool)in_stack_fffffffffffffd2e) {
                          path::operator=((path *)in_stack_fffffffffffffd30,
                                          (path *)CONCAT17(in_stack_fffffffffffffd2f,
                                                           CONCAT16(in_stack_fffffffffffffd2e,
                                                                    CONCAT24(
                                                  in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28))));
                          local_74 = 5;
                        }
                        else {
                          path::operator/=(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
                          local_74 = 5;
                        }
                      }
                      path::~path((path *)0x12fed0);
                    }
                  }
                  file_status::~file_status((file_status *)&stack0xfffffffffffffdf8);
                  if (local_74 == 0) {
                    local_74 = 0;
                  }
                }
                else {
                  path::operator/=(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
                  local_74 = 5;
                }
              }
              else {
                path::parent_path((path *)in_stack_fffffffffffffdf8);
                path::operator=((path *)in_stack_fffffffffffffd30,
                                (path *)CONCAT17(in_stack_fffffffffffffd2f,
                                                 CONCAT16(in_stack_fffffffffffffd2e,
                                                          CONCAT24(in_stack_fffffffffffffd2c,
                                                                   in_stack_fffffffffffffd28))));
                path::~path((path *)0x12fbf2);
                local_74 = 5;
              }
            }
            else {
              local_74 = 5;
            }
            path::~path((path *)0x12ff28);
            in_stack_fffffffffffffd28 = local_74;
            if ((local_74 != 0) && (local_74 != 5)) goto LAB_0012ff74;
            path::iterator::operator++
                      ((iterator *)
                       CONCAT17(in_stack_fffffffffffffd47,
                                CONCAT16(in_stack_fffffffffffffd46,
                                         CONCAT15(in_stack_fffffffffffffd45,
                                                  CONCAT14(in_stack_fffffffffffffd44,
                                                           in_stack_fffffffffffffd40)))));
          }
          local_74 = 4;
LAB_0012ff74:
          path::iterator::~iterator((iterator *)0x12ff81);
          path::iterator::~iterator((iterator *)0x12ff8e);
          if (local_74 != 4) goto LAB_00130009;
          path::operator=((path *)in_stack_fffffffffffffd30,
                          (path *)CONCAT17(in_stack_fffffffffffffd2f,
                                           CONCAT16(in_stack_fffffffffffffd2e,
                                                    CONCAT24(in_stack_fffffffffffffd2c,
                                                             in_stack_fffffffffffffd28))));
        } while ((local_95 & 1) != 0);
        std::error_code::clear((error_code *)in_stack_fffffffffffffd30);
        path::path((path *)in_stack_fffffffffffffd30,
                   (path *)CONCAT17(in_stack_fffffffffffffd2f,
                                    CONCAT16(in_stack_fffffffffffffd2e,
                                             CONCAT24(in_stack_fffffffffffffd2c,
                                                      in_stack_fffffffffffffd28))));
        local_74 = 1;
      }
    }
LAB_00130009:
    file_status::~file_status(local_70);
    path::~path((path *)0x130023);
    path::~path((path *)0x130030);
  }
  return (path *)p_00;
}

Assistant:

GHC_INLINE path canonical(const path& p, std::error_code& ec)
{
    if (p.empty()) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    path work = p.is_absolute() ? p : absolute(p, ec);
    path result;

    auto fs = status(work, ec);
    if (ec) {
        return path();
    }
    if (fs.type() == file_type::not_found) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    bool redo;
    do {
        auto rootPathLen = work._prefixLength + work.root_name_length() + (work.has_root_directory() ? 1 : 0);
        redo = false;
        result.clear();
        for (auto pe : work) {
            if (pe.empty() || pe == ".") {
                continue;
            }
            else if (pe == "..") {
                result = result.parent_path();
                continue;
            }
            else if ((result / pe).string().length() <= rootPathLen) {
                result /= pe;
                continue;
            }
            auto sls = symlink_status(result / pe, ec);
            if (ec) {
                return path();
            }
            if (is_symlink(sls)) {
                redo = true;
                auto target = read_symlink(result / pe, ec);
                if (ec) {
                    return path();
                }
                if (target.is_absolute()) {
                    result = target;
                    continue;
                }
                else {
                    result /= target;
                    continue;
                }
            }
            else {
                result /= pe;
            }
        }
        work = result;
    } while (redo);
    ec.clear();
    return result;
}